

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v6_3.c
# Opt level: O2

int can_fixup_bittiming_v6_3
              (net_device *dev,can_bittiming *bt,can_bittiming_const *btc,netlink_ext_ack *extack)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = bt->phase_seg1 + bt->prop_seg;
  iVar4 = -0x16;
  if ((((btc->tseg1_min <= uVar5) && (uVar5 <= btc->tseg1_max)) &&
      (btc->tseg2_min <= bt->phase_seg2)) && (bt->phase_seg2 <= btc->tseg2_max)) {
    can_sjw_set_default(bt);
    uVar6 = bt->sjw;
    if (((uVar6 <= btc->sjw_max) && (uVar6 <= bt->phase_seg1)) && (uVar6 <= bt->phase_seg2)) {
      uVar2 = (ulong)bt->tq * (ulong)(dev->priv).clock.freq;
      uVar6 = btc->brp_inc;
      if (1 < (ulong)uVar6) {
        uVar2 = uVar2 / uVar6;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2 + 499999999;
      uVar3 = 1;
      if (1 < uVar6) {
        uVar3 = uVar6;
      }
      uVar3 = SUB164(auVar1 / ZEXT816(1000000000),0) * uVar3;
      bt->brp = uVar3;
      if ((btc->brp_min <= uVar3) && (uVar3 <= btc->brp_max)) {
        uVar6 = bt->phase_seg1 + bt->prop_seg + bt->phase_seg2 + 1;
        iVar4 = 0;
        bt->bitrate = (dev->priv).clock.freq / (uVar6 * uVar3);
        bt->sample_point = (uVar5 * 1000 + 1000) / uVar6;
        uVar5 = (dev->priv).clock.freq;
        bt->tq = (__u32)(((ulong)(uVar5 >> 1) + (ulong)uVar3 * 1000000000) / (ulong)uVar5);
      }
    }
  }
  return iVar4;
}

Assistant:

static int can_fixup_bittiming(const struct net_device *dev, struct can_bittiming *bt,
			       const struct can_bittiming_const *btc,
			       struct netlink_ext_ack *extack)
{
	const unsigned int tseg1 = bt->prop_seg + bt->phase_seg1;
	const struct can_priv *priv = netdev_priv(dev);
	u64 brp64;
	int err;

	if (tseg1 < btc->tseg1_min) {
		NL_SET_ERR_MSG_FMT(extack, "prop-seg + phase-seg1: %u less than tseg1-min: %u",
				   tseg1, btc->tseg1_min);
		return -EINVAL;
	}
	if (tseg1 > btc->tseg1_max) {
		NL_SET_ERR_MSG_FMT(extack, "prop-seg + phase-seg1: %u greater than tseg1-max: %u",
				   tseg1, btc->tseg1_max);
		return -EINVAL;
	}
	if (bt->phase_seg2 < btc->tseg2_min) {
		NL_SET_ERR_MSG_FMT(extack, "phase-seg2: %u less than tseg2-min: %u",
				   bt->phase_seg2, btc->tseg2_min);
		return -EINVAL;
	}
	if (bt->phase_seg2 > btc->tseg2_max) {
		NL_SET_ERR_MSG_FMT(extack, "phase-seg2: %u greater than tseg2-max: %u",
				   bt->phase_seg2, btc->tseg2_max);
		return -EINVAL;
	}

	can_sjw_set_default(bt);

	err = can_sjw_check(dev, bt, btc, extack);
	if (err)
		return err;

	brp64 = (u64)priv->clock.freq * (u64)bt->tq;
	if (btc->brp_inc > 1)
		do_div(brp64, btc->brp_inc);
	brp64 += 500000000UL - 1;
	do_div(brp64, 1000000000UL); /* the practicable BRP */
	if (btc->brp_inc > 1)
		brp64 *= btc->brp_inc;
	bt->brp = (u32)brp64;

	if (bt->brp < btc->brp_min) {
		NL_SET_ERR_MSG_FMT(extack, "resulting brp: %u less than brp-min: %u",
				   bt->brp, btc->brp_min);
		return -EINVAL;
	}
	if (bt->brp > btc->brp_max) {
		NL_SET_ERR_MSG_FMT(extack, "resulting brp: %u greater than brp-max: %u",
				   bt->brp, btc->brp_max);
		return -EINVAL;
	}

	bt->bitrate = priv->clock.freq / (bt->brp * can_bit_time(bt));
	bt->sample_point = ((CAN_SYNC_SEG + tseg1) * 1000) / can_bit_time(bt);
	bt->tq = DIV_U64_ROUND_CLOSEST(mul_u32_u32(bt->brp, NSEC_PER_SEC),
				       priv->clock.freq);

	return 0;
}